

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_skip_whitespace(char *str)

{
  byte bVar1;
  
  while( true ) {
    bVar1 = *str;
    if (((bVar1 == 0) || (0x20 < bVar1)) ||
       ((0x80001f00U >> ((int)(char)bVar1 - 1U & 0x1f) & 1) == 0)) break;
    str = (char *)((byte *)str + 1);
  }
  return str;
}

Assistant:

const char* sx_skip_whitespace(const char* str)
{
    while (*str) {
        if (sx_isspace(*str))
            ++str;
        else
            break;
    }
    return str;
}